

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_12.cpp
# Opt level: O2

void __thiscall Game::resetGame(Game *this)

{
  Game *in_RSI;
  _Vector_base<int,_std::allocator<int>_> _Stack_28;
  
  (this->gameResult).bulls = 0;
  (this->gameResult).cows = 0;
  this->guessCount = 0;
  getReferenceNumbers((vector<int,_std::allocator<int>_> *)&_Stack_28,in_RSI);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->referenceNumbers,&_Stack_28);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&_Stack_28);
  return;
}

Assistant:

void Game::resetGame()
{
	gameResult = GameResult(0, 0);
	guessCount = 0;
	referenceNumbers = getReferenceNumbers();
}